

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_err_Error.cpp
# Opt level: O3

String * __thiscall
axl::err::StdErrorProvider::getStackErrorDescription
          (String *__return_storage_ptr__,StdErrorProvider *this,ErrorRef *error)

{
  uint uVar1;
  size_t sVar2;
  ErrorHdr *pEVar3;
  ErrorHdr *this_00;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_68;
  StringRef local_50;
  
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).
           m_hdr + 1) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).
           m_length + 1) = 0;
  (__return_storage_ptr__->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p =
       (C *)0x0;
  (__return_storage_ptr__->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_hdr =
       (BufHdr *)0x0;
  sVar2 = (error->super_BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>).m_size;
  if (0x18 < (long)sVar2) {
    pEVar3 = (error->super_BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>).m_p;
    this_00 = pEVar3 + 1;
    do {
      if ((__return_storage_ptr__->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).
          m_length != 0) {
        sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::insert
                  (__return_storage_ptr__,0xffffffffffffffff,": ",0xffffffffffffffff);
      }
      local_68.m_p = (ErrorHdr *)0x0;
      local_68.m_hdr = (BufHdr *)0x0;
      local_68.m_size = 0;
      uVar1 = this_00->m_size;
      rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::attachBufHdr(&local_68,(BufHdr *)0x0);
      if (uVar1 < 0x19) {
        uVar1 = 0x18;
      }
      local_68.m_size = (size_t)uVar1;
      local_68.m_p = this_00;
      ErrorHdr::getDescription(&local_50,this_00);
      sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::insert
                (__return_storage_ptr__,0xffffffffffffffff,&local_50);
      sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release(&local_50);
      rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_68);
      this_00 = (ErrorHdr *)((long)&this_00->m_size + (ulong)this_00->m_size);
    } while (this_00 < (ErrorHdr *)((long)&pEVar3->m_size + sVar2));
  }
  return __return_storage_ptr__;
}

Assistant:

sl::String
StdErrorProvider::getStackErrorDescription(const ErrorRef& error) {
	sl::String string;

	const ErrorHdr* p = error + 1;
	const void* end = error.getEnd();

	while (p < end) {
		ASSERT(p->m_size >= sizeof(ErrorHdr));

		if (!string.isEmpty())
			string += ": ";

		string += ErrorRef(p).getDescription();
		p = (ErrorHdr*)((uchar_t*)p + p->m_size);
	}

	return string;
}